

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nullifFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  CollSeq *pColl_00;
  CollSeq *pColl;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  pColl_00 = sqlite3GetFuncCollSeq(context);
  iVar1 = sqlite3MemCompare(*argv,argv[1],pColl_00);
  if (iVar1 != 0) {
    sqlite3_result_value(context,*argv);
  }
  return;
}

Assistant:

static void nullifFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  CollSeq *pColl = sqlite3GetFuncCollSeq(context);
  UNUSED_PARAMETER(NotUsed);
  if( sqlite3MemCompare(argv[0], argv[1], pColl)!=0 ){
    sqlite3_result_value(context, argv[0]);
  }
}